

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

int __thiscall FatSystem::readData(FatSystem *this,unsigned_long_long address,char *buffer,int size)

{
  int iVar1;
  ostream *this_00;
  ssize_t sVar2;
  bool local_39;
  int local_2c;
  int pos;
  int n;
  int size_local;
  char *buffer_local;
  unsigned_long_long address_local;
  FatSystem *this_local;
  
  if ((this->totalSize != 0xffffffffffffffff) && (this->totalSize < address + (long)size)) {
    this_00 = std::operator<<((ostream *)&std::cerr,"! Trying to read outside the disk");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  lseek64(this->fd,this->globalOffset + address,0);
  local_2c = 0;
  pos = size;
  do {
    sVar2 = read(this->fd,buffer + local_2c,(long)pos);
    iVar1 = (int)sVar2;
    if (0 < iVar1) {
      local_2c = iVar1 + local_2c;
      pos = pos - iVar1;
    }
    local_39 = 0 < pos && 0 < iVar1;
  } while (local_39);
  return iVar1;
}

Assistant:

int FatSystem::readData(unsigned long long address, char *buffer, int size)
{
    if (totalSize != -1 && address+size > totalSize) {
        cerr << "! Trying to read outside the disk" << endl;
    }

    lseek64(fd, globalOffset+address, SEEK_SET);

    int n;
    int pos = 0;
    do {
        n = read(fd, buffer+pos, size);

        if (n > 0) {
            pos += n;
            size -= n;
        }
    } while ((size>0) && (n>0));

    return n;
}